

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::TestSpecParser::preprocessPattern_abi_cxx11_
          (string *__return_storage_ptr__,TestSpecParser *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ulong local_28;
  size_t i;
  TestSpecParser *local_18;
  TestSpecParser *this_local;
  string *token;
  
  i._7_1_ = 0;
  local_18 = this;
  this_local = (TestSpecParser *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,&this->m_patternName);
  for (local_28 = 0; uVar1 = local_28,
      sVar3 = clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&this->m_escapeChars), uVar1 < sVar3; local_28 = local_28 + 1) {
    pvVar4 = clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_escapeChars,local_28);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_68,__return_storage_ptr__,0,*pvVar4 - local_28);
    pvVar4 = clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_escapeChars,local_28);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_98,__return_storage_ptr__,(*pvVar4 - local_28) + 1,0xffffffffffffffff);
    std::operator+(&local_48,&local_68,&local_98);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=(__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_68);
  }
  clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->m_escapeChars);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"exclude:",&local_b9);
  bVar2 = startsWith(__return_storage_ptr__,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  if (bVar2) {
    this->m_exclusion = true;
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_e0,__return_storage_ptr__,8,0xffffffffffffffff);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=(__return_storage_ptr__,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (&this->m_patternName);
  this->m_realPatternPos = 0;
  return __return_storage_ptr__;
}

Assistant:

std::string TestSpecParser::preprocessPattern() {
        std::string token = m_patternName;
        for (std::size_t i = 0; i < m_escapeChars.size(); ++i)
            token = token.substr(0, m_escapeChars[i] - i) + token.substr(m_escapeChars[i] - i + 1);
        m_escapeChars.clear();
        if (startsWith(token, "exclude:")) {
            m_exclusion = true;
            token = token.substr(8);
        }

        m_patternName.clear();
        m_realPatternPos = 0;

        return token;
    }